

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptExternalFunction * __thiscall
Js::JavascriptLibrary::CreateStdCallExternalFunction
          (JavascriptLibrary *this,StdCallJavascriptMethod entryPoint,Var name,void *callbackState)

{
  DynamicType **ppDVar1;
  JavascriptExternalFunction *this_00;
  JavascriptExternalFunction *function;
  void *callbackState_local;
  Var name_local;
  StdCallJavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->stdCallFunctionWithDeferredPrototypeType);
  this_00 = CreateIdMappedExternalFunction<void*(*)(void*,void**,unsigned_short,Js::StdCallJavascriptMethodInfo*,void*)>
                      (this,(_func_void_ptr_void_ptr_void_ptr_ptr_unsigned_short_StdCallJavascriptMethodInfo_ptr_void_ptr
                             *)entryPoint,*ppDVar1);
  RuntimeFunction::SetFunctionNameId(&this_00->super_RuntimeFunction,name);
  JavascriptExternalFunction::SetCallbackState(this_00,callbackState);
  return this_00;
}

Assistant:

JavascriptExternalFunction* JavascriptLibrary::CreateStdCallExternalFunction(StdCallJavascriptMethod entryPoint, Var name, void *callbackState)
    {
        JavascriptExternalFunction* function = this->CreateIdMappedExternalFunction(entryPoint, stdCallFunctionWithDeferredPrototypeType);
        function->SetFunctionNameId(name);
        function->SetCallbackState(callbackState);
        return function;
    }